

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCanon.c
# Opt level: O2

Ivy_Obj_t * Ivy_CanonExor(Ivy_Man_t *p,Ivy_Obj_t *pObj0,Ivy_Obj_t *pObj1)

{
  Ivy_Obj_t *pIVar1;
  
  pIVar1 = Ivy_ObjCreateGhost(p,(Ivy_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe),
                              (Ivy_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe),IVY_EXOR,
                              IVY_INIT_NONE);
  pIVar1 = Ivy_CanonPair_rec(p,pIVar1);
  return (Ivy_Obj_t *)((ulong)pIVar1 ^ (ulong)(((uint)pObj1 ^ (uint)pObj0) & 1));
}

Assistant:

Ivy_Obj_t * Ivy_CanonExor( Ivy_Man_t * p, Ivy_Obj_t * pObj0, Ivy_Obj_t * pObj1 )
{
    Ivy_Obj_t * pGhost, * pResult;
    int fCompl = Ivy_IsComplement(pObj0) ^ Ivy_IsComplement(pObj1);
    pObj0 = Ivy_Regular(pObj0);
    pObj1 = Ivy_Regular(pObj1);
    pGhost = Ivy_ObjCreateGhost( p, pObj0, pObj1, IVY_EXOR, IVY_INIT_NONE );
    pResult = Ivy_CanonPair_rec( p, pGhost );
    return Ivy_NotCond( pResult, fCompl );
}